

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

void __thiscall KDReports::ReportPrivate::debugLayoutToPdf(ReportPrivate *this,char *fileName)

{
  byte bVar1;
  undefined1 auVar2 [12];
  QString local_138;
  QString local_120;
  QPrinter local_108 [8];
  QPrinter printer;
  undefined1 local_e0 [7];
  bool oldLayoutDirty;
  undefined1 local_c8 [8];
  QString htmlText;
  QArrayDataPointer<char16_t> local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  undefined1 local_40 [8];
  QFile html;
  char *fileName_local;
  ReportPrivate *this_local;
  char16_t *str;
  
  QFile::decodeName(&local_70,fileName);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_a0,(Data *)0x0,L".html",5);
  QString::QString(&local_88,&local_a0);
  operator+(&local_58,&local_70,&local_88);
  QFile::QFile((QFile *)local_40,(QString *)&local_58);
  QString::~QString(&local_58);
  QString::~QString(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QString::~QString(&local_70);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)&htmlText.d.size,WriteOnly);
  bVar1 = QFile::open((QFlags_conflict1 *)local_40);
  if ((bVar1 & 1) == 0) {
    auVar2 = qt_assert("html.open(QIODevice::WriteOnly)",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
                       ,0x192);
    htmlText.d.size._4_4_ = auVar2._8_4_;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QString::~QString(&local_70);
    _Unwind_Resume(auVar2._0_8_);
  }
  (*this->m_layout->_vptr_AbstractReportLayout[0x13])(local_c8);
  QString::toUtf8((QByteArray *)local_e0,(QString *)local_c8);
  QIODevice::write((QByteArray *)local_40);
  QByteArray::~QByteArray((QByteArray *)local_e0);
  QFileDevice::close();
  this->m_pageContentSizeDirty = false;
  QPrinter::QPrinter(local_108,0);
  Report::setupPrinter(this->q,local_108);
  QFile::decodeName(&local_120,fileName);
  QPrinter::setOutputFileName((QString *)local_108);
  QString::~QString(&local_120);
  doPrint(this,local_108,(QWidget *)0x0);
  QString::QString(&local_138);
  QPrinter::setOutputFileName((QString *)local_108);
  QString::~QString(&local_138);
  this->m_pageContentSizeDirty = true;
  QPrinter::~QPrinter(local_108);
  QString::~QString((QString *)local_c8);
  QFile::~QFile((QFile *)local_40);
  return;
}

Assistant:

void KDReports::ReportPrivate::debugLayoutToPdf(const char *fileName)
{
    // for calling from gdb

    QFile html(QFile::decodeName(fileName) + QStringLiteral(".html"));
    Q_ASSERT(html.open(QIODevice::WriteOnly));
    const QString htmlText = m_layout->toHtml();
    html.write(htmlText.toUtf8());
    html.close();

    bool oldLayoutDirty = true;
    m_pageContentSizeDirty = false;
    QPrinter printer;
    q->setupPrinter(&printer);
    printer.setOutputFileName(QFile::decodeName(fileName));
    doPrint(&printer, nullptr);
    printer.setOutputFileName(QString());
    m_pageContentSizeDirty = oldLayoutDirty;
}